

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::draw(SlicePlane *this)

{
  undefined8 uVar1;
  element_type *peVar2;
  mat4 projMat;
  mat4 viewMat;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8 [64];
  undefined1 local_68 [64];
  
  if ((this->drawPlane).value == true) {
    view::getCameraViewMatrix();
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"u_viewMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,(string *)local_c8,local_68);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
    view::getCameraPerspectiveMatrix();
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"u_projMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_e8,local_a8);
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0]);
    }
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"u_objectMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_108,&(this->objectTransform).value);
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0]);
    }
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"u_lengthScale","");
    (*peVar2->_vptr_ShaderProgram[6])(state::lengthScale,peVar2,local_128);
    if (local_128[0] != local_118) {
      operator_delete(local_128[0]);
    }
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"u_color","");
    uVar1._0_4_ = (this->color).value.field_0;
    uVar1._4_4_ = (this->color).value.field_1;
    (*peVar2->_vptr_ShaderProgram[9])
              (uVar1,(ulong)(uint)(this->color).value.field_2,peVar2,local_148);
    if (local_148[0] != local_138) {
      operator_delete(local_148[0]);
    }
    peVar2 = (this->planeProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"u_transparency","");
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)(this->transparency).value,peVar2,local_168);
    if (local_168[0] != local_158) {
      operator_delete(local_168[0]);
    }
    (**(code **)(*render::engine + 0x50))(render::engine,0);
    (**(code **)(*render::engine + 0x68))(render::engine,0);
    (**(code **)(*render::engine + 0x120))();
    (*((this->planeProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void SlicePlane::draw() {
  if (!drawPlane.get()) return;

  // Set uniforms
  glm::mat4 viewMat = view::getCameraViewMatrix();
  planeProgram->setUniform("u_viewMatrix", glm::value_ptr(viewMat));
  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  planeProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  planeProgram->setUniform("u_objectMatrix", glm::value_ptr(objectTransform.get()));
  planeProgram->setUniform("u_lengthScale", state::lengthScale);
  planeProgram->setUniform("u_color", color.get());
  planeProgram->setUniform("u_transparency", transparency.get());

  // glm::vec3 center{objectTransform.get()[3][0], objectTransform.get()[3][1], objectTransform.get()[3][2]};
  // planeProgram->setUniform("u_center", center);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBackfaceCull(false);
  render::engine->applyTransparencySettings();
  planeProgram->draw();
}